

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

aiMatrix4x4 * __thiscall
Assimp::ColladaParser::CalculateResultTransform
          (aiMatrix4x4 *__return_storage_ptr__,ColladaParser *this,
          vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
          *pTransforms)

{
  aiVector3t<float> *paVar1;
  pointer pTVar2;
  aiVector3t<float> aVar3;
  aiVector3D up;
  aiMatrix4x4 rot;
  aiVector3D dir;
  aiVector3t<float> local_b8;
  float local_ac;
  aiMatrix4x4t<float> local_a8;
  aiVector3t<float> local_68;
  float local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  for (pTVar2 = (pTransforms->
                super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar2 != (pTransforms->
                super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                )._M_impl.super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    switch(pTVar2->mType) {
    case TF_LOOKAT:
      local_ac = pTVar2->f[2];
      local_5c = pTVar2->f[5];
      local_a8.a3 = pTVar2->f[8];
      local_a8.a1 = (float)*(undefined8 *)(pTVar2->f + 6);
      local_a8.a2 = (float)((ulong)*(undefined8 *)(pTVar2->f + 6) >> 0x20);
      local_58 = *(undefined8 *)pTVar2->f;
      uStack_50 = 0;
      local_48 = *(undefined8 *)(pTVar2->f + 3);
      uStack_40 = 0;
      paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_a8);
      local_b8.x = paVar1->x;
      local_b8.y = paVar1->y;
      local_b8.z = paVar1->z;
      local_a8.a1 = (float)local_48 - (float)local_58;
      local_a8.a2 = local_48._4_4_ - local_58._4_4_;
      local_a8.a3 = local_5c - local_ac;
      paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_a8);
      local_68.x = paVar1->x;
      local_68.y = paVar1->y;
      local_68.z = paVar1->z;
      aVar3 = operator^(&local_68,&local_b8);
      local_a8.a3 = aVar3.z;
      local_a8.a1 = aVar3.x;
      local_a8.a2 = aVar3.y;
      paVar1 = aiVector3t<float>::Normalize((aiVector3t<float> *)&local_a8);
      local_a8.a1 = paVar1->x;
      local_a8.b1 = paVar1->y;
      local_a8.a3 = -local_68.x;
      local_a8.c3 = -local_68.z;
      local_a8.a2 = local_b8.x;
      local_a8.a4 = (float)local_58;
      local_a8.b2 = local_b8.y;
      local_a8._24_8_ = CONCAT44(local_58._4_4_,local_68.y) ^ 0x80000000;
      local_a8.c2 = local_b8.z;
      local_a8.c1 = paVar1->z;
      local_a8.c4 = local_ac;
      local_a8.d1 = 0.0;
      local_a8.d2 = 0.0;
      local_a8.d3 = 0.0;
      local_a8.d4 = 1.0;
      break;
    case TF_ROTATE:
      local_a8.a1 = 1.0;
      local_a8.a2 = 0.0;
      local_a8.a3 = 0.0;
      local_a8.a4 = 0.0;
      local_a8.b1 = 0.0;
      local_a8.b2 = 1.0;
      local_a8.b3 = 0.0;
      local_a8.b4 = 0.0;
      local_a8.c1 = 0.0;
      local_a8.c2 = 0.0;
      local_a8.c3 = 1.0;
      local_a8.c4 = 0.0;
      local_a8.d1 = 0.0;
      local_a8.d2 = 0.0;
      local_a8.d3 = 0.0;
      local_a8.d4 = 1.0;
      local_b8.z = pTVar2->f[2];
      local_b8.x = pTVar2->f[0];
      local_b8.y = pTVar2->f[1];
      aiMatrix4x4t<float>::Rotation((pTVar2->f[3] * 3.1415927) / 180.0,&local_b8,&local_a8);
      break;
    case TF_TRANSLATE:
      local_a8.a4 = pTVar2->f[0];
      local_a8.c4 = pTVar2->f[2];
      local_a8.a1 = 1.0;
      local_a8.a2 = 0.0;
      local_a8.a3 = 0.0;
      local_a8.b1 = 0.0;
      local_a8.b2 = 1.0;
      local_a8.c1 = 0.0;
      local_a8.c2 = 0.0;
      local_a8.c3 = 1.0;
      local_a8.d3 = 0.0;
      local_a8.d1 = 0.0;
      local_a8.d2 = 0.0;
      local_a8.d4 = 1.0;
      local_a8._24_8_ = (ulong)(uint)pTVar2->f[1] << 0x20;
      break;
    case TF_SCALE:
      local_a8.a1 = pTVar2->f[0];
      local_a8.b2 = pTVar2->f[1];
      local_a8.c3 = pTVar2->f[2];
      local_a8.a2 = 0.0;
      local_a8.a3 = 0.0;
      local_a8.a4 = 0.0;
      local_a8.b1 = 0.0;
      local_a8.b3 = 0.0;
      local_a8.b4 = 0.0;
      local_a8.c1 = 0.0;
      local_a8.c2 = 0.0;
      local_a8.c4 = 0.0;
      local_a8.d1 = 0.0;
      local_a8.d2 = 0.0;
      local_a8.d3 = 0.0;
      local_a8.d4 = 1.0;
      break;
    case TF_SKEW:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                    ,0xd75,
                    "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                   );
    case TF_MATRIX:
      local_a8.a1 = (float)*(undefined8 *)pTVar2->f;
      local_a8.a2 = (float)((ulong)*(undefined8 *)pTVar2->f >> 0x20);
      local_a8.a3 = (float)*(undefined8 *)(pTVar2->f + 2);
      local_a8.a4 = (float)((ulong)*(undefined8 *)(pTVar2->f + 2) >> 0x20);
      local_a8._24_8_ = *(undefined8 *)(pTVar2->f + 6);
      local_a8.b1 = (float)*(undefined8 *)(pTVar2->f + 4);
      local_a8.b2 = (float)((ulong)*(undefined8 *)(pTVar2->f + 4) >> 0x20);
      local_a8.c1 = pTVar2->f[8];
      local_a8.c2 = pTVar2->f[9];
      local_a8.c3 = (float)*(undefined8 *)(pTVar2->f + 10);
      local_a8.c4 = (float)((ulong)*(undefined8 *)(pTVar2->f + 10) >> 0x20);
      local_a8.d1 = (float)*(undefined8 *)(pTVar2->f + 0xc);
      local_a8.d2 = (float)((ulong)*(undefined8 *)(pTVar2->f + 0xc) >> 0x20);
      local_a8.d3 = (float)*(undefined8 *)(pTVar2->f + 0xe);
      local_a8.d4 = (float)((ulong)*(undefined8 *)(pTVar2->f + 0xe) >> 0x20);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                    ,0xd7f,
                    "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                   );
    }
    aiMatrix4x4t<float>::operator*=(__return_storage_ptr__,&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 ColladaParser::CalculateResultTransform(const std::vector<Transform>& pTransforms) const
{
    aiMatrix4x4 res;

    for (std::vector<Transform>::const_iterator it = pTransforms.begin(); it != pTransforms.end(); ++it)
    {
        const Transform& tf = *it;
        switch (tf.mType)
        {
        case TF_LOOKAT:
        {
            aiVector3D pos(tf.f[0], tf.f[1], tf.f[2]);
            aiVector3D dstPos(tf.f[3], tf.f[4], tf.f[5]);
            aiVector3D up = aiVector3D(tf.f[6], tf.f[7], tf.f[8]).Normalize();
            aiVector3D dir = aiVector3D(dstPos - pos).Normalize();
            aiVector3D right = (dir ^ up).Normalize();

            res *= aiMatrix4x4(
                right.x, up.x, -dir.x, pos.x,
                right.y, up.y, -dir.y, pos.y,
                right.z, up.z, -dir.z, pos.z,
                0, 0, 0, 1);
            break;
        }
        case TF_ROTATE:
        {
            aiMatrix4x4 rot;
            ai_real angle = tf.f[3] * ai_real(AI_MATH_PI) / ai_real(180.0);
            aiVector3D axis(tf.f[0], tf.f[1], tf.f[2]);
            aiMatrix4x4::Rotation(angle, axis, rot);
            res *= rot;
            break;
        }
        case TF_TRANSLATE:
        {
            aiMatrix4x4 trans;
            aiMatrix4x4::Translation(aiVector3D(tf.f[0], tf.f[1], tf.f[2]), trans);
            res *= trans;
            break;
        }
        case TF_SCALE:
        {
            aiMatrix4x4 scale(tf.f[0], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[1], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[2], 0.0f,
                0.0f, 0.0f, 0.0f, 1.0f);
            res *= scale;
            break;
        }
        case TF_SKEW:
            // TODO: (thom)
            ai_assert(false);
            break;
        case TF_MATRIX:
        {
            aiMatrix4x4 mat(tf.f[0], tf.f[1], tf.f[2], tf.f[3], tf.f[4], tf.f[5], tf.f[6], tf.f[7],
                tf.f[8], tf.f[9], tf.f[10], tf.f[11], tf.f[12], tf.f[13], tf.f[14], tf.f[15]);
            res *= mat;
            break;
        }
        default:
            ai_assert(false);
            break;
        }
    }

    return res;
}